

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_Mesh * __thiscall ON_MeshRef::SetMeshForExperts(ON_MeshRef *this,ON_Mesh **mesh)

{
  ON_Mesh *__p;
  __shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)this);
  __p = (ON_Mesh *)0x0;
  if (*mesh != &ON_Mesh::Empty) {
    __p = *mesh;
  }
  *mesh = (ON_Mesh *)0x0;
  if (__p != (ON_Mesh *)0x0) {
    std::__shared_ptr<ON_Mesh,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ON_Mesh,void>
              ((__shared_ptr<ON_Mesh,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,__p);
    std::__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)this,&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  return __p;
}

Assistant:

class ON_Mesh* ON_MeshRef::SetMeshForExperts(
  class ON_Mesh*& mesh
  )
{
  Clear();
  ON_Mesh* managed_mesh = ( mesh == &ON_Mesh::Empty ) ? nullptr : mesh;
  mesh = nullptr;
  if (nullptr != managed_mesh )
    m_mesh_sp = std::shared_ptr<class ON_Mesh>(managed_mesh);
  return managed_mesh;
}